

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

string * __thiscall cppcms::widgets::base_widget::id_abi_cxx11_(base_widget *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 8));
  return in_RDI;
}

Assistant:

std::string base_widget::id()
{
	return id_;
}